

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O1

int __thiscall
RhombicLattice::neighbour(RhombicLattice *this,int vertexIndex,string *direction,int sign)

{
  cartesian4 cVar1;
  cartesian4 cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  invalid_argument *piVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  cartesian4 local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  cartesian4 local_1b0;
  ostringstream local_1a0 [376];
  
  if ((sign != -1) && (sign != 1)) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Sign must be either 1 or -1.");
LAB_00125d5e:
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar3 = std::__cxx11::string::compare((char *)direction);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)direction);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)direction);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)direction);
        if (iVar3 != 0) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar8,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
          goto LAB_00125d5e;
        }
      }
    }
  }
  local_200 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  iVar5 = local_200.w;
  iVar4 = std::__cxx11::string::compare((char *)direction);
  iVar3 = sign >> 0x1f;
  iVar9 = local_200.x;
  if (iVar5 == 1) {
    if (iVar4 == 0) {
      local_200.y = (uint)(0 < sign) + local_200.y;
      local_200.x = (uint)(0 < sign) + iVar9;
      local_200.z = local_200.z - iVar3;
      local_200.w = 0;
    }
    iVar5 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_200;
    if (iVar5 == 0) {
      iVar5 = local_200.x + (uint)(0 < sign);
      local_200.x = iVar5;
      cVar2 = local_200;
      local_200.z = cVar1.z;
      local_200.w = cVar1.w;
      local_200._0_8_ = cVar2._0_8_;
      local_200.z = local_200.z + (uint)(0 < sign);
      cVar2 = local_200;
      local_200.y = cVar1.y;
      local_200._8_8_ = cVar2._8_8_;
      local_200.y = local_200.y - iVar3;
      local_200.w = 0;
    }
    iVar5 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_200;
    if (iVar5 == 0) {
      iVar5 = local_200.y;
      local_200.z = (uint)(0 < sign) + local_200.z;
      local_200.y = (uint)(0 < sign) + iVar5;
      local_200.w = cVar1.w;
      local_200.x = cVar1.x;
      local_200.x = local_200.x - iVar3;
      local_200.w = 0;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    if (iVar3 == 0) {
      uVar6 = (uint)(0 < sign);
      uVar11._0_4_ = uVar6 + local_200.x;
      uVar11._4_4_ = uVar6 + local_200.y;
      local_200.z = uVar6 + local_200.z;
      local_200.w = 0;
      local_200._0_8_ = uVar11;
LAB_00125b9f:
    }
  }
  else {
    if (iVar4 == 0) {
      local_200.y = iVar3 + local_200.y;
      local_200.x = iVar3 + iVar9;
      local_200.z = local_200.z - (uint)(0 < sign);
      local_200.w = 1;
    }
    iVar5 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_200;
    if (iVar5 == 0) {
      iVar5 = local_200.x + iVar3;
      local_200.x = iVar5;
      cVar2 = local_200;
      local_200.z = cVar1.z;
      local_200.w = cVar1.w;
      local_200._0_8_ = cVar2._0_8_;
      local_200.z = local_200.z + iVar3;
      cVar2 = local_200;
      local_200.y = cVar1.y;
      local_200._8_8_ = cVar2._8_8_;
      local_200.y = local_200.y - (uint)(0 < sign);
      local_200.w = 1;
    }
    iVar5 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_200;
    if (iVar5 == 0) {
      iVar5 = local_200.y;
      local_200.z = iVar3 + local_200.z;
      local_200.y = iVar3 + iVar5;
      local_200.w = cVar1.w;
      local_200.x = cVar1.x;
      local_200.x = local_200.x - (uint)(0 < sign);
      local_200.w = 1;
    }
    iVar5 = std::__cxx11::string::compare((char *)direction);
    if (iVar5 == 0) {
      uVar10._0_4_ = local_200.x + iVar3;
      uVar10._4_4_ = local_200.y + iVar3;
      local_200.z = local_200.z + iVar3;
      local_200.w = 1;
      local_200._0_8_ = uVar10;
      goto LAB_00125b9f;
    }
  }
  if ((((-1 < local_200.x) && (iVar3 = (this->super_Lattice).l, local_200.x < iVar3)) &&
      (-1 < local_200.y)) &&
     (((local_200.y < iVar3 && (-1 < local_200.z)) && (local_200.z < iVar3)))) {
    iVar3 = Lattice::coordinateToIndex(&this->super_Lattice,&local_200);
    return iVar3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1b0 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = '\0';
  if (sign == -1) {
    std::operator+(&local_1f0,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_00125ca1;
    std::operator+(&local_1f0,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
LAB_00125ca1:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"RhombicLattice::neighbour, ",0x1b);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," neighbour of ",0xe);
  poVar7 = operator<<(poVar7,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," is outside the lattice.",0x18);
  std::__cxx11::stringbuf::str();
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,(string *)&local_1f0);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int RhombicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.y = (coordinate.y + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.x = (coordinate.x + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.y = (coordinate.y - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.x = (coordinate.x - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.w = 1;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "RhombicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}